

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceReleaseQueue.hpp
# Opt level: O2

void __thiscall
Diligent::ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::DiscardStaleResources
          (ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this,
          Uint64 SubmittedCmdBuffNumber,Uint64 FenceValue)

{
  _Elt_pointer ppVar1;
  Uint64 local_38;
  
  local_38 = FenceValue;
  std::mutex::lock(&this->m_StaleObjectsMutex);
  std::mutex::lock(&this->m_ReleaseQueueMutex);
  while ((ppVar1 = (this->m_StaleResources).
                   super__Deque_base<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur,
         (this->m_StaleResources).
         super__Deque_base<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar1 &&
         (ppVar1->first <= SubmittedCmdBuffNumber))) {
    std::
    deque<std::pair<unsigned_long,Diligent::DynamicStaleResourceWrapper>,Diligent::STDAllocator<std::pair<unsigned_long,Diligent::DynamicStaleResourceWrapper>,Diligent::IMemoryAllocator>>
    ::emplace_back<unsigned_long&,Diligent::DynamicStaleResourceWrapper>
              ((deque<std::pair<unsigned_long,Diligent::DynamicStaleResourceWrapper>,Diligent::STDAllocator<std::pair<unsigned_long,Diligent::DynamicStaleResourceWrapper>,Diligent::IMemoryAllocator>>
                *)&this->m_ReleaseQueue,&local_38,&ppVar1->second);
    std::
    deque<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
    ::pop_front(&this->m_StaleResources);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_StaleObjectsMutex);
  return;
}

Assistant:

void DiscardStaleResources(Uint64 SubmittedCmdBuffNumber, Uint64 FenceValue)
    {
        // Only discard these stale objects that were released before CmdBuffNumber
        // was executed
        std::lock_guard<std::mutex> StaleObjectsLock(m_StaleObjectsMutex);
        std::lock_guard<std::mutex> ReleaseQueueLock(m_ReleaseQueueMutex);
        while (!m_StaleResources.empty())
        {
            auto& FirstStaleObj = m_StaleResources.front();
            if (FirstStaleObj.first <= SubmittedCmdBuffNumber)
            {
                m_ReleaseQueue.emplace_back(FenceValue, std::move(FirstStaleObj.second));
                m_StaleResources.pop_front();
            }
            else
                break;
        }
    }